

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O2

void __thiscall async_reader::run(async_reader *this)

{
  stream_socket *psVar1;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_48;
  mutable_buffer local_40;
  
  psVar1 = this->sock;
  booster::aio::buffer(&local_40,this->buf);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_reader>
            (&local_48,*this);
  booster::aio::stream_socket::async_read_some((mutable_buffer *)psVar1,(callback *)&local_40);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_48.call_ptr);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_40.super_buffer_impl<char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return;
}

Assistant:

void run()
	{
		sock->async_read_some(io::buffer(*buf),*this);
	}